

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

Token __thiscall slang::parsing::Token::deepClone(Token *this,BumpAllocator *alloc)

{
  int iVar1;
  Trivia *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar2;
  undefined8 in_RCX;
  SourceLocation *pSVar3;
  int __flags;
  __extent_storage<18446744073709551615UL> src;
  undefined8 extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  Info *extraout_RDX_01;
  void *in_R8;
  long lVar4;
  Info *pIVar5;
  Trivia *t;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  string_view sVar7;
  Token TVar8;
  SmallVector<slang::parsing::Trivia,_2UL> triviaBuffer;
  anon_union_12_4_39e54f29_for_Trivia_0 local_78;
  undefined2 local_6c;
  SmallVector<slang::parsing::Trivia,_2UL> local_68;
  undefined4 extraout_var_01;
  
  if (this->info == (Info *)0x0) {
    uVar2._0_2_ = this->kind;
    uVar2._2_1_ = this->field_0x2;
    uVar2._3_1_ = this->numFlags;
    uVar2._4_4_ = this->rawLen;
    pIVar5 = (Info *)0x0;
  }
  else {
    sVar6 = trivia(this);
    SmallVector<slang::parsing::Trivia,_2UL>::SmallVector
              (&local_68,sVar6._M_extent._M_extent_value._M_extent_value);
    sVar6 = trivia(this);
    src = sVar6._M_extent._M_extent_value;
    this_00 = sVar6._M_ptr;
    if ((EVP_PKEY_CTX *)src._M_extent_value != (EVP_PKEY_CTX *)0x0) {
      lVar4 = src._M_extent_value << 4;
      do {
        iVar1 = Trivia::clone(this_00,(__fn *)alloc,(void *)0x1,(int)in_RCX,in_R8);
        local_78.rawText.ptr = (char *)CONCAT44(extraout_var,iVar1);
        local_78.rawText.len = (uint32_t)extraout_RDX;
        local_6c = (undefined2)((ulong)extraout_RDX >> 0x20);
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&local_68.super_SmallVectorBase<slang::parsing::Trivia>,
                   (Trivia *)&local_78.rawText);
        this_00 = this_00 + 1;
        lVar4 = lVar4 + -0x10;
        src._M_extent_value = (size_t)extraout_RDX_00;
      } while (lVar4 != 0);
    }
    iVar1 = SmallVectorBase<slang::parsing::Trivia>::copy
                      (&local_68.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)alloc
                       ,(EVP_PKEY_CTX *)src._M_extent_value);
    sVar7 = rawText(this);
    if (this->info == (Info *)0x0) {
      pSVar3 = (SourceLocation *)&SourceLocation::NoLocation;
    }
    else {
      pSVar3 = &this->info->location;
    }
    iVar1 = clone(this,(__fn *)alloc,(void *)CONCAT44(extraout_var_00,iVar1),__flags,
                  (void *)sVar7._M_len,sVar7._M_str,*pSVar3);
    uVar2 = CONCAT44(extraout_var_01,iVar1);
    pIVar5 = extraout_RDX_01;
    if (local_68.super_SmallVectorBase<slang::parsing::Trivia>.data_ !=
        (pointer)local_68.super_SmallVectorBase<slang::parsing::Trivia>.firstElement) {
      operator_delete(local_68.super_SmallVectorBase<slang::parsing::Trivia>.data_);
    }
  }
  TVar8.info = pIVar5;
  TVar8.kind = (short)uVar2;
  TVar8._2_1_ = (char)((ulong)uVar2 >> 0x10);
  TVar8.numFlags.raw = (char)((ulong)uVar2 >> 0x18);
  TVar8.rawLen = (int)((ulong)uVar2 >> 0x20);
  return TVar8;
}

Assistant:

Token Token::deepClone(BumpAllocator& alloc) const {
    if (!info) {
        // No extra information, don't alloc extra info
        // If allocated it, the valid() function would fail
        return *this;
    }

    SmallVector<Trivia> triviaBuffer(trivia().size(), UninitializedTag());
    for (const auto& t : trivia())
        triviaBuffer.push_back(t.clone(alloc, true));
    return clone(alloc, triviaBuffer.copy(alloc), rawText(), location());
}